

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O2

XMLSize_t xercesc_4_0::XMLString::hash(char *tohash,XMLSize_t hashModulus)

{
  ulong uVar1;
  
  uVar1 = 0;
  if (tohash != (char *)0x0) {
    for (; (long)*tohash != 0; tohash = tohash + 1) {
      uVar1 = (uVar1 >> 0x18) + uVar1 * 0x26 + (long)*tohash;
    }
  }
  return uVar1 % hashModulus;
}

Assistant:

XMLSize_t XMLString::hash(   const   char* const    tohash
                            , const XMLSize_t       hashModulus)
{
    XMLSize_t hashVal = 0;
    if (tohash) {
        const char* curCh = tohash;
        while (*curCh)
        {
            XMLSize_t top = hashVal >> 24;
            hashVal += (hashVal * 37) + top + (XMLSize_t)(*curCh);
            curCh++;
        }
    }

    // Divide by modulus
    return hashVal % hashModulus;
}